

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

uint8_t * xml_string_clone(xml_string *s)

{
  uint8_t *clone;
  xml_string *s_local;
  
  if (s == (xml_string *)0x0) {
    s_local = (xml_string *)0x0;
  }
  else {
    s_local = (xml_string *)calloc(s->length + 1,1);
    xml_string_copy(s,(uint8_t *)s_local,s->length);
    *(uint8_t *)((long)&s_local->buffer + s->length) = '\0';
  }
  return (uint8_t *)s_local;
}

Assistant:

static uint8_t* xml_string_clone(struct xml_string* s) {
	if (!s) {
		return 0;
	}

	uint8_t* clone = calloc(s->length + 1, sizeof(uint8_t));

	xml_string_copy(s, clone, s->length);
	clone[s->length] = 0;

	return clone;
}